

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

optional<unsigned_long_long> __thiscall QMetaEnum::keysToValue64(QMetaEnum *this,char *keys)

{
  QByteArrayView key;
  QByteArrayView qualifiedKey;
  QByteArrayView scope;
  QByteArrayView v;
  undefined1 uVar1;
  bool bVar2;
  iterator pQVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  optional<unsigned_long_long> oVar5;
  QByteArrayView *untrimmed;
  iterator __end1;
  iterator __begin1;
  QVarLengthArray<QByteArrayView,_10LL> *__range1;
  bool r;
  quint64 value;
  anon_class_16_2_3fe3235e lookup;
  EnumExtendMode mode;
  optional<unsigned_long_long> thisValue;
  R_conflict6 parsed;
  QVarLengthArray<QByteArrayView,_10LL> list;
  unsigned_long_long *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  QByteArrayView *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  QVarLengthArray<QByteArrayView,_10LL> *list_00;
  storage_type *in_stack_fffffffffffffe28;
  iterator local_1b0;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  storage_type *in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe70 [14];
  undefined1 in_stack_fffffffffffffe7f;
  qsizetype qVar6;
  long *plVar7;
  undefined1 local_100 [40];
  _Storage<unsigned_long_long,_true> local_d8;
  undefined1 local_d0;
  undefined1 local_c8 [32];
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI == 0) || (in_RSI == 0)) {
    std::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&local_d8);
    uVar4 = extraout_RDX;
  }
  else {
    enumExtendMode((QMetaEnum *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    qVar6 = 0;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    list_00 = (QVarLengthArray<QByteArrayView,_10LL> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    plVar7 = in_RDI;
    QVarLengthArray<QByteArrayView,_10LL>::QVarLengthArray
              ((QVarLengthArray<QByteArrayView,_10LL> *)local_c8);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               (char **)in_stack_fffffffffffffdd8);
    v.m_data = (storage_type *)plVar7;
    v.m_size = qVar6;
    uVar1 = parseEnumFlags(v,list_00);
    if ((bool)uVar1) {
      local_1b0 = QVLABase<QByteArrayView>::begin((QVLABase<QByteArrayView> *)0x365671);
      pQVar3 = QVLABase<QByteArrayView>::end
                         ((QVLABase<QByteArrayView> *)
                          CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      for (; local_1b0 != pQVar3; local_1b0 = local_1b0 + 1) {
        memset(local_100,0xaa,0x28);
        QByteArrayView::trimmed(in_stack_fffffffffffffdd8);
        qualifiedKey.m_size._4_4_ = in_stack_fffffffffffffe64;
        qualifiedKey.m_size._0_4_ = in_stack_fffffffffffffe60;
        qualifiedKey.m_data = in_stack_fffffffffffffe68;
        parse_scope(qualifiedKey);
        bVar2 = std::optional::operator_cast_to_bool((optional<QByteArrayView> *)0x36570f);
        if (bVar2) {
          std::optional<QByteArrayView>::operator*((optional<QByteArrayView> *)0x365722);
          scope.m_data._6_1_ = uVar1;
          scope._0_14_ = in_stack_fffffffffffffe70;
          scope.m_data._7_1_ = in_stack_fffffffffffffe7f;
          in_stack_fffffffffffffdf7 =
               isScopeMatch(scope,(QMetaEnum *)
                                  CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
          if (!(bool)in_stack_fffffffffffffdf7) {
            std::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&local_d8);
            goto LAB_0036585d;
          }
        }
        key.m_data = in_stack_fffffffffffffe28;
        key.m_size = (qsizetype)in_RDI;
        keysToValue64::anon_class_16_2_3fe3235e::operator()((anon_class_16_2_3fe3235e *)list_00,key)
        ;
        bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long_long> *)0x3657e0);
        if (!bVar2) {
          std::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&local_d8);
          goto LAB_0036585d;
        }
        std::optional<unsigned_long_long>::operator*((optional<unsigned_long_long> *)0x3657f3);
      }
      std::optional<unsigned_long_long>::optional<unsigned_long_long,_true>
                ((optional<unsigned_long_long> *)
                 CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdc8);
    }
    else {
      std::optional<unsigned_long_long>::optional((optional<unsigned_long_long> *)&local_d8);
    }
LAB_0036585d:
    QVarLengthArray<QByteArrayView,_10LL>::~QVarLengthArray
              ((QVarLengthArray<QByteArrayView,_10LL> *)
               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    uVar4 = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  oVar5.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  oVar5.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_engaged = (bool)local_d0;
  oVar5.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = local_d8._M_value;
  return (optional<unsigned_long_long>)
         oVar5.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>;
}

Assistant:

std::optional<quint64> QMetaEnum::keysToValue64(const char *keys) const
{
    if (!mobj || !keys)
        return std::nullopt;

    EnumExtendMode mode = enumExtendMode(*this);
    auto lookup = [&] (QByteArrayView key) -> std::optional<quint64> {
        for (int i = data.keyCount() - 1; i >= 0; --i) {
            if (key == stringDataView(mobj, mobj->d.data[data.data() + 2*i]))
                return value_helper(i, mode);
        }
        return std::nullopt;
    };

    quint64 value = 0;
    QVarLengthArray<QByteArrayView, 10> list;
    const bool r = parseEnumFlags(QByteArrayView{keys}, list);
    if (!r)
        return std::nullopt;
    for (const auto &untrimmed : list) {
        const auto parsed = parse_scope(untrimmed.trimmed());
        if (parsed.scope && !isScopeMatch(*parsed.scope, this))
            return std::nullopt; // wrong type name in qualified name
        if (auto thisValue = lookup(parsed.key))
            value |= *thisValue;
        else
            return std::nullopt; // no such enumerator
    }
    return value;
}